

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_string::append
          (xpath_string *this,xpath_string *o,xpath_allocator *alloc)

{
  size_t __n;
  xpath_allocator *this_00;
  void *__dest;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  char_t *result;
  size_t result_length;
  size_t source_length;
  size_t target_length;
  xpath_string *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffc8;
  void *ptr;
  
  if (*(char *)*in_RSI != '\0') {
    if (((*(char *)*in_RDI == '\0') && ((*(byte *)(in_RDI + 1) & 1) == 0)) &&
       ((*(byte *)(in_RSI + 1) & 1) == 0)) {
      *in_RDI = *in_RSI;
    }
    else {
      __n = length(in_stack_ffffffffffffffb0);
      this_00 = (xpath_allocator *)length(in_stack_ffffffffffffffb0);
      ptr = (void *)((long)&this_00->_root + __n);
      __dest = xpath_allocator::reallocate(this_00,ptr,in_stack_ffffffffffffffc8,(size_t)in_RDI);
      if (__dest != (void *)0x0) {
        if ((*(byte *)(in_RDI + 1) & 1) == 0) {
          memcpy(__dest,(void *)*in_RDI,__n);
        }
        memcpy((void *)((long)__dest + __n),(void *)*in_RSI,(size_t)this_00);
        *(undefined1 *)((long)__dest + (long)ptr) = 0;
        *in_RDI = __dest;
        *(undefined1 *)(in_RDI + 1) = 1;
        in_RDI[2] = ptr;
      }
    }
  }
  return;
}

Assistant:

void append(const xpath_string& o, xpath_allocator* alloc)
		{
			// skip empty sources
			if (!*o._buffer) return;

			// fast append for constant empty target and constant source
			if (!*_buffer && !_uses_heap && !o._uses_heap)
			{
				_buffer = o._buffer;
			}
			else
			{
				// need to make heap copy
				size_t target_length = length();
				size_t source_length = o.length();
				size_t result_length = target_length + source_length;

				// allocate new buffer
				char_t* result = static_cast<char_t*>(alloc->reallocate(_uses_heap ? const_cast<char_t*>(_buffer) : NULL, (target_length + 1) * sizeof(char_t), (result_length + 1) * sizeof(char_t)));
				if (!result) return;

				// append first string to the new buffer in case there was no reallocation
				if (!_uses_heap) memcpy(result, _buffer, target_length * sizeof(char_t));

				// append second string to the new buffer
				memcpy(result + target_length, o._buffer, source_length * sizeof(char_t));
				result[result_length] = 0;

				// finalize
				_buffer = result;
				_uses_heap = true;
				_length_heap = result_length;
			}
		}